

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DGXMLScanner::scanAttValue
          (DGXMLScanner *this,XMLAttDef *attDef,XMLCh *attrName,XMLBuffer *toFill)

{
  XMLSize_t XVar1;
  ReaderMgr *this_00;
  ulong uVar2;
  ulong uVar3;
  XMLSize_t XVar4;
  bool bVar5;
  XMLBuffer *pXVar6;
  XMLBuffer *pXVar7;
  bool bVar8;
  bool bVar9;
  XMLCh XVar10;
  int iVar11;
  uint uVar12;
  byte *in_R8;
  undefined7 uVar13;
  bool escaped;
  XMLCh nextCh;
  XMLCh secondCh;
  XMLCh quoteCh;
  XMLCh tmpBuf [9];
  byte local_8d;
  XMLCh local_8c;
  undefined1 local_8a;
  bool local_89;
  ulong local_88;
  UnexpectedEOFException *local_80;
  short local_72;
  ulong local_70;
  uint local_68;
  XMLCh local_62;
  XMLCh *local_60;
  XMLBuffer *local_58;
  ulong local_50;
  XMLCh local_48 [12];
  
  if (attDef == (XMLAttDef *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = (ulong)(uint)attDef->fType;
  }
  toFill->fIndex = 0;
  this_00 = &(this->super_XMLScanner).fReaderMgr;
  local_60 = attrName;
  bVar9 = ReaderMgr::skipIfQuote(this_00,&local_62);
  if (!bVar9) {
    return false;
  }
  local_89 = true;
  if ((attDef != (XMLAttDef *)0x0) && (attDef->fExternalAttribute == true)) {
    local_89 = (int)local_50 - 8U < 0xfffffff9;
  }
  uVar2 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
  local_72 = 0;
  uVar12 = 1;
  local_70 = 0;
  bVar9 = false;
  local_58 = toFill;
LAB_0029ff04:
  local_80 = (UnexpectedEOFException *)CONCAT44(local_80._4_4_,uVar12);
  local_88 = (ulong)uVar12;
  bVar8 = bVar9;
LAB_0029ff11:
  do {
    bVar5 = bVar8;
    local_8c = ReaderMgr::getNextChar(this_00);
    if (local_8c == L'\0') {
      local_80 = (UnexpectedEOFException *)__cxa_allocate_exception(0x30);
      UnexpectedEOFException::UnexpectedEOFException
                (local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/DGXMLScanner.cpp"
                 ,0xb04,Gen_UnexpectedEOF,(this->super_XMLScanner).fMemoryManager);
      __cxa_throw(local_80,&UnexpectedEOFException::typeinfo,XMLException::~XMLException);
    }
    if (local_8c == local_62) {
      uVar3 = ((this->super_XMLScanner).fReaderMgr.fCurReader)->fReaderNum;
      bVar9 = uVar2 == uVar3;
      if (bVar9) {
        return bVar9;
      }
      if (uVar3 <= uVar2 && !bVar9) {
        XMLScanner::emitError(&this->super_XMLScanner,PartialMarkupInEntity);
        return bVar9;
      }
    }
    local_8d = 0;
    if (local_8c == L'&') {
      in_R8 = &local_8d;
      iVar11 = (*(this->super_XMLScanner).super_XMLBufferFullHandler._vptr_XMLBufferFullHandler[0xd]
               )(this,1,&local_8c);
      bVar8 = false;
      bVar9 = bVar5;
      if (iVar11 != 1) goto LAB_0029ff11;
    }
    else {
      if ((local_8c & 0xfc00U) == 0xdc00) {
        if (!bVar5) {
          XMLScanner::emitError(&this->super_XMLScanner,Unexpected2ndSurrogateChar);
        }
      }
      else {
        if ((local_8c & 0xfc00U) == 0xd800) {
          bVar9 = true;
          if (bVar5) {
            XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
            bVar9 = bVar5;
          }
          goto LAB_002a0030;
        }
        if (bVar5) {
          XMLScanner::emitError(&this->super_XMLScanner,Expected2ndSurrogateChar);
        }
        if ((((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable[(ushort)local_8c] &
            0x40) == 0) {
          XMLString::binToText
                    ((uint)(ushort)local_8c,local_48,8,0x10,(this->super_XMLScanner).fMemoryManager)
          ;
          in_R8 = (byte *)0x0;
          XMLScanner::emitError
                    (&this->super_XMLScanner,InvalidCharacterInAttrValue,local_60,local_48,
                     (XMLCh *)0x0,(XMLCh *)0x0);
        }
      }
      bVar9 = false;
    }
LAB_002a0030:
    if ((local_8d == 0) && (local_8c == L'<')) {
      in_R8 = (byte *)0x0;
      XMLScanner::emitError
                (&this->super_XMLScanner,BracketInAttrValue,local_60,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    pXVar6 = local_58;
    if ((int)local_50 == 0) {
      if (((local_8d == 0) && ((ushort)local_8c < 0xe)) &&
         ((0x2600U >> ((ushort)local_8c & 0x1f) & 1) != 0)) {
        if (((this->super_XMLScanner).fStandalone == true) &&
           ((this->super_XMLScanner).fValidate == true && local_89 == false)) {
          XMLValidator::emitError
                    ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,local_60,
                     (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
        }
        local_8c = L' ';
      }
      in_R8 = (byte *)(local_70 & 0xffffffff);
      uVar12 = (uint)local_80;
      goto LAB_002a0236;
    }
    uVar13 = (undefined7)((ulong)in_R8 >> 8);
    bVar8 = bVar9;
    if ((int)local_88 != 0) {
      if ((ulong)(ushort)local_8c != 0x20) {
        in_R8 = (byte *)CONCAT71(uVar13,1);
        uVar12 = 1;
        if ((-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                        [(ushort)local_8c]) || (local_8d != 0)) goto LAB_002a0236;
      }
      local_88 = 0;
      if (((this->super_XMLScanner).fStandalone == true) &&
         ((this->super_XMLScanner).fValidate == true && local_89 == false)) {
        if ((local_70 & 1) != 0) {
          if (local_8c == L' ') goto LAB_0029ff11;
          local_88 = 0;
          XVar10 = ReaderMgr::peekNextChar(this_00);
          local_88 = 0;
          if (-1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                         [(ushort)XVar10]) goto LAB_0029ff11;
        }
        local_88 = 0;
        in_R8 = (byte *)0x0;
        XMLValidator::emitError
                  ((this->super_XMLScanner).fValidator,NoAttNormForStandalone,local_60,(XMLCh *)0x0,
                   (XMLCh *)0x0,(XMLCh *)0x0);
      }
      goto LAB_0029ff11;
    }
    if (((local_8d & local_8c != L' ') != 0) ||
       (local_88 = 0,
       -1 < (char)((this->super_XMLScanner).fReaderMgr.fCurReader)->fgCharCharsTable
                  [(ushort)local_8c])) break;
  } while( true );
  in_R8 = (byte *)CONCAT71(uVar13,1);
  uVar12 = 1;
  if ((local_70 & 1) != 0) {
    if (local_58->fIndex == local_58->fCapacity) {
      local_80 = (UnexpectedEOFException *)((ulong)local_80 & 0xffffffff00000000);
      XMLBuffer::ensureCapacity(local_58,1);
      in_R8 = (byte *)CONCAT71((int7)((ulong)in_R8 >> 8),1);
    }
    XVar1 = pXVar6->fIndex;
    pXVar6->fIndex = XVar1 + 1;
    pXVar6->fBuffer[XVar1] = L' ';
    uVar12 = 1;
  }
LAB_002a0236:
  pXVar6 = local_58;
  local_88._0_2_ = local_8c;
  if (local_58->fIndex == local_58->fCapacity) {
    local_80 = (UnexpectedEOFException *)CONCAT44(local_80._4_4_,uVar12);
    local_70 = (ulong)in_R8 & 0xffffffff;
    local_8a = SUB81(in_R8,0);
    local_68 = uVar12;
    XMLBuffer::ensureCapacity(local_58,1);
    in_R8 = (byte *)CONCAT71((int7)((ulong)in_R8 >> 8),local_8a);
    uVar12 = local_68;
  }
  pXVar7 = local_58;
  XVar4 = pXVar6->fIndex;
  XVar1 = XVar4 + 1;
  pXVar6->fIndex = XVar1;
  pXVar6->fBuffer[XVar4] = (XMLCh)local_88;
  local_70 = (ulong)in_R8 & 0xffffffff;
  if (local_72 != 0) {
    local_88 = CONCAT62(local_88._2_6_,local_72);
    if (XVar1 == local_58->fCapacity) {
      local_80 = (UnexpectedEOFException *)CONCAT44(local_80._4_4_,uVar12);
      local_70 = (ulong)in_R8 & 0xffffffff;
      local_8a = SUB81(in_R8,0);
      local_68 = uVar12;
      XMLBuffer::ensureCapacity(local_58,1);
      in_R8 = (byte *)CONCAT71((int7)((ulong)in_R8 >> 8),local_8a);
      uVar12 = local_68;
    }
    XVar1 = pXVar7->fIndex;
    pXVar7->fIndex = XVar1 + 1;
    pXVar7->fBuffer[XVar1] = (XMLCh)local_88;
    local_72 = 0;
    local_70 = (ulong)in_R8 & 0xffffffff;
  }
  goto LAB_0029ff04;
}

Assistant:

bool DGXMLScanner::scanAttValue(  const   XMLAttDef* const    attDef
                                  , const XMLCh *const attrName
                                  ,       XMLBuffer&          toFill)
{
    enum States
    {
        InWhitespace
        , InContent
    };

    // Get the type and name
    const XMLAttDef::AttTypes type = (attDef)
                        ?attDef->getType()
                        :XMLAttDef::CData;

    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr.skipIfQuote(quoteCh))
        return false;

    //  We have to get the current reader because we have to ignore closing
    //  quotes until we hit the same reader again.
    const XMLSize_t curReader = fReaderMgr.getCurrentReaderNum();

    // check to see if it's a tokenized type that is declared externally 
    bool  isAttTokenizedExternal = (attDef)
                                   ?attDef->isExternal() && (type == XMLAttDef::ID || 
                                                             type == XMLAttDef::IDRef || 
                                                             type == XMLAttDef::IDRefs || 
                                                             type == XMLAttDef::Entity || 
                                                             type == XMLAttDef::Entities || 
                                                             type == XMLAttDef::NmToken || 
                                                             type == XMLAttDef::NmTokens)
                                   :false;

    //  Loop until we get the attribute value. Note that we use a double
    //  loop here to avoid the setup/teardown overhead of the exception
    //  handler on every round.
    XMLCh   nextCh;
    XMLCh   secondCh = 0;
    States  curState = InContent;
    bool    firstNonWS = false;
    bool    gotLeadingSurrogate = false;
    bool    escaped;
    while (true)
    {
    try
    {
        while(true)
        {
            nextCh = fReaderMgr.getNextChar();

            if (!nextCh)
                ThrowXMLwithMemMgr(UnexpectedEOFException, XMLExcepts::Gen_UnexpectedEOF, fMemoryManager);

            // Check for our ending quote in the same entity
            if (nextCh == quoteCh)
            {
                if (curReader == fReaderMgr.getCurrentReaderNum())
                    return true;

                // Watch for spillover into a previous entity
                if (curReader > fReaderMgr.getCurrentReaderNum())
                {
                    emitError(XMLErrs::PartialMarkupInEntity);
                    return false;
                }
            }

            //  Check for an entity ref now, before we let it affect our
            //  whitespace normalization logic below. We ignore the empty flag
            //  in this one.
            escaped = false;
            if (nextCh == chAmpersand)
            {
                if (scanEntityRef(true, nextCh, secondCh, escaped) != EntityExp_Returned)
                {
                    gotLeadingSurrogate = false;
                    continue;
                }
            }
            else if ((nextCh >= 0xD800) && (nextCh <= 0xDBFF))
            {
                // Deal with surrogate pairs
                //  Its a leading surrogate. If we already got one, then
                //  issue an error, else set leading flag to make sure that
                //  we look for a trailing next time.
                if (gotLeadingSurrogate)
                    emitError(XMLErrs::Expected2ndSurrogateChar);
                else
                    gotLeadingSurrogate = true;
            }
            else
            {
                //  If its a trailing surrogate, make sure that we are
                //  prepared for that. Else, its just a regular char so make
                //  sure that we were not expected a trailing surrogate.
                if ((nextCh >= 0xDC00) && (nextCh <= 0xDFFF))
                {
                    // Its trailing, so make sure we were expecting it
                    if (!gotLeadingSurrogate)
                        emitError(XMLErrs::Unexpected2ndSurrogateChar);
                }
                else
                {
                    //  Its just a char, so make sure we were not expecting a
                    //  trailing surrogate.
                    if (gotLeadingSurrogate)
                        emitError(XMLErrs::Expected2ndSurrogateChar);

                    // Its got to at least be a valid XML character
                    if (!fReaderMgr.getCurrentReader()->isXMLChar(nextCh))
                    {
                        XMLCh tmpBuf[9];
                        XMLString::binToText
                        (
                            nextCh
                            , tmpBuf
                            , 8
                            , 16
                            , fMemoryManager
                        );
                        emitError(XMLErrs::InvalidCharacterInAttrValue, attrName, tmpBuf);
                    }
                }
                gotLeadingSurrogate = false;
            }

            //  If its not escaped, then make sure its not a < character, which
            //  is not allowed in attribute values.
            if (!escaped && (nextCh == chOpenAngle))
                emitError(XMLErrs::BracketInAttrValue, attrName);

            //  If the attribute is a CDATA type we do simple replacement of
            //  tabs and new lines with spaces, if the character is not escaped
            //  by way of a char ref.
            //
            //  Otherwise, we do the standard non-CDATA normalization of
            //  compressing whitespace to single spaces and getting rid of leading
            //  and trailing whitespace.
            if (type == XMLAttDef::CData)
            {
                if (!escaped)
                {
                    if ((nextCh == 0x09) || (nextCh == 0x0A) || (nextCh == 0x0D))
                    {
                        // Check Validity Constraint for Standalone document declaration
                        // XML 1.0, Section 2.9
                        if (fStandalone && fValidate && isAttTokenizedExternal)
                        {
                             // Can't have a standalone document declaration of "yes" if  attribute
                             // values are subject to normalisation
                             fValidator->emitError(XMLValid::NoAttNormForStandalone, attrName);
                        }
                        nextCh = chSpace;
                    }
                }
            }
            else
            {
                if (curState == InWhitespace)
                {
                    if ((escaped && nextCh != chSpace) || !fReaderMgr.getCurrentReader()->isWhitespace(nextCh))
                    {
                        if (firstNonWS)
                            toFill.append(chSpace);
                        curState = InContent;
                        firstNonWS = true;
                    }
                    else
                    {
                        continue;
                    }
                }
                else if (curState == InContent)
                {
                    if ((nextCh == chSpace) ||
                        (fReaderMgr.getCurrentReader()->isWhitespace(nextCh) && !escaped))
                    {
                        curState = InWhitespace;

                        // Check Validity Constraint for Standalone document declaration
                        // XML 1.0, Section 2.9
                        if (fStandalone && fValidate && isAttTokenizedExternal)
                        {
                            if (!firstNonWS || (nextCh != chSpace && fReaderMgr.lookingAtSpace()))
                            {
                                 // Can't have a standalone document declaration of "yes" if  attribute
                                 // values are subject to normalisation
                                 fValidator->emitError(XMLValid::NoAttNormForStandalone, attrName);
                            }
                        }
                        continue;
                    }
                    firstNonWS = true;
                }
            }

            // Else add it to the buffer
            toFill.append(nextCh);

            if (secondCh)
            {
                toFill.append(secondCh);
                secondCh=0;
            }
        }
    }
    catch(const EndOfEntityException&)
    {
        // Just eat it and continue.
        gotLeadingSurrogate = false;
        escaped = false;
    }
    }
    return true;
}